

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_fread(zip_t *zip,char *filename)

{
  mz_bool mVar1;
  int iVar2;
  undefined1 local_488 [8];
  mz_zip_archive_file_stat info;
  mz_uint32 xattr;
  mz_uint idx;
  mz_zip_archive *pzip;
  char *filename_local;
  zip_t *zip_local;
  
  info.m_time._0_4_ = 0;
  if (zip == (zip_t *)0x0) {
    zip_local._4_4_ = -1;
  }
  else {
    memset(local_488,0,0x458);
    if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) && (-1 < (zip->entry).index)) {
      info.m_time._4_4_ = (mz_uint)(zip->entry).index;
      mVar1 = mz_zip_reader_is_file_a_directory(&zip->archive,info.m_time._4_4_);
      if (mVar1 == 0) {
        mVar1 = mz_zip_reader_extract_to_file(&zip->archive,info.m_time._4_4_,filename,0);
        if (mVar1 == 0) {
          zip_local._4_4_ = -0x13;
        }
        else {
          mVar1 = mz_zip_reader_file_stat
                            (&zip->archive,info.m_time._4_4_,(mz_zip_archive_file_stat *)local_488);
          if (mVar1 == 0) {
            zip_local._4_4_ = -0x13;
          }
          else {
            info.m_time._0_4_ = info.m_uncomp_size._4_4_ >> 0x10;
            if ((((uint)info.m_time == 0) || (0xffff < (uint)info.m_time)) ||
               (iVar2 = chmod(filename,(uint)info.m_time), -1 < iVar2)) {
              zip_local._4_4_ = 0;
            }
            else {
              zip_local._4_4_ = -0x14;
            }
          }
        }
      }
      else {
        zip_local._4_4_ = -0x11;
      }
    }
    else {
      zip_local._4_4_ = -3;
    }
  }
  return zip_local._4_4_;
}

Assistant:

int zip_entry_fread(struct zip_t *zip, const char *filename) {
  mz_zip_archive *pzip = NULL;
  mz_uint idx;
  mz_uint32 xattr = 0;
  mz_zip_archive_file_stat info;

  if (!zip) {
    // zip_t handler is not initialized
    return ZIP_ENOINIT;
  }

  memset((void *)&info, 0, sizeof(mz_zip_archive_file_stat));
  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING ||
      zip->entry.index < (ssize_t)0) {
    // the entry is not found or we do not have read access
    return ZIP_ENOENT;
  }

  idx = (mz_uint)zip->entry.index;
  if (mz_zip_reader_is_file_a_directory(pzip, idx)) {
    // the entry is a directory
    return ZIP_EINVENTTYPE;
  }

  if (!mz_zip_reader_extract_to_file(pzip, idx, filename, 0)) {
    return ZIP_ENOFILE;
  }

#if defined(_MSC_VER) || defined(PS4)
  (void)xattr; // unused
#else
  if (!mz_zip_reader_file_stat(pzip, idx, &info)) {
    // Cannot get information about zip archive;
    return ZIP_ENOFILE;
  }

  xattr = (info.m_external_attr >> 16) & 0xFFFF;
  if (xattr > 0 && xattr <= MZ_UINT16_MAX) {
    if (CHMOD(filename, (mode_t)xattr) < 0) {
      return ZIP_ENOPERM;
    }
  }
#endif

  return 0;
}